

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  raw_ostream *prVar6;
  undefined1 *puVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  AnnotationOptsT AVar11;
  char **__s;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  StringRef SVar21;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef Str_16;
  StringRef Str_17;
  StringRef Str_18;
  StringRef Str_19;
  StringRef Str_20;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  ModuleAnnotator annotator;
  ModuleWriter writer;
  DGDumper dumper;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> criteria_nodes;
  LLVMContext context;
  SlicerOptions options;
  Slicer slicer;
  _Head_base<0UL,_llvm::Module_*,_false> local_610;
  ModuleAnnotator local_608;
  ModuleWriter local_5f0;
  _Head_base<0UL,_dg::LLVMDependenceGraph_*,_false> local_5e0;
  DGDumper local_5d8;
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_5c0;
  undefined1 local_590 [32];
  Offset local_570;
  undefined1 local_568 [376];
  _Alloc_hider local_3f0;
  bool local_39e;
  bool local_39d;
  _Alloc_hider local_398;
  _Alloc_hider local_378;
  string local_358 [96];
  Slicer local_2f8;
  
  __s = (char **)(ulong)(uint)argc;
  setupStackTraceOnError(argc,argv);
  local_590._8_8_ = 0;
  local_590._16_8_ = 0;
  local_570.offset =
       (type)std::
             _Function_handler<void_(llvm::raw_ostream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer.cpp:140:33)>
             ::_M_invoke;
  local_590._24_8_ =
       std::
       _Function_handler<void_(llvm::raw_ostream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer.cpp:140:33)>
       ::_M_manager;
  llvm::cl::SetVersionPrinter(local_590 + 8);
  if ((code *)local_590._24_8_ != (code *)0x0) {
    (*(code *)local_590._24_8_)(local_590 + 8,local_590 + 8,3);
  }
  puVar14 = local_568;
  uVar3 = 1;
  parseSlicerOptions((int)puVar14,__s,SUB81(argv,0),true);
  if (dump_dg_only[0x80] == '\x01') {
    local_2f8.M._0_1_ = 1;
    dump_dg[0x80] = '\x01';
    if (dump_dg._176_8_ == 0) {
      iVar4 = std::__throw_bad_function_call();
      if (statistics[0x80] == '\x01') {
        puVar7 = *(undefined1 **)(puVar14 + 0x20);
        if (puVar7 == puVar14 + 0x18) {
          uVar20 = 0;
          uVar19 = 0;
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          uVar19 = 0;
          uVar20 = 0;
          do {
            puVar12 = puVar7 + -0x38;
            if (puVar7 == (undefined1 *)0x0) {
              puVar12 = (undefined1 *)0x0;
            }
            if (*(undefined1 **)(puVar12 + 0x48) != puVar12 + 0x48) {
              uVar20 = uVar20 + 1;
              for (puVar13 = *(undefined1 **)(puVar12 + 0x50); puVar13 != puVar12 + 0x48;
                  puVar13 = *(undefined1 **)(puVar13 + 8)) {
                puVar15 = puVar13 + -0x18;
                if (puVar13 == (undefined1 *)0x0) {
                  puVar15 = (undefined1 *)0x0;
                }
                lVar5 = 0;
                for (puVar16 = *(undefined1 **)(puVar15 + 0x30); puVar16 != puVar15 + 0x28;
                    puVar16 = *(undefined1 **)(puVar16 + 8)) {
                  lVar5 = lVar5 + 1;
                }
                uVar10 = uVar10 + lVar5;
                uVar19 = uVar19 + 1;
              }
            }
            puVar7 = *(undefined1 **)(puVar7 + 8);
          } while (puVar7 != puVar14 + 0x18);
        }
        uVar17 = 0;
        for (puVar7 = *(undefined1 **)(puVar14 + 0x10); puVar7 != puVar14 + 8;
            puVar7 = *(undefined1 **)(puVar7 + 8)) {
          uVar17 = uVar17 + 1;
        }
        if (__s != (char **)0x0) {
          prVar6 = (raw_ostream *)llvm::errs();
          sVar8 = strlen((char *)__s);
          Str_15.Length = sVar8;
          Str_15.Data = (char *)__s;
          llvm::raw_ostream::operator<<(prVar6,Str_15);
        }
        prVar6 = (raw_ostream *)llvm::errs();
        Str_16.Length = 0x21;
        Str_16.Data = "Globals/Functions/Blocks/Instr.: ";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_16);
        prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar17);
        Str_17.Length = 1;
        Str_17.Data = " ";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_17);
        prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar20);
        Str_18.Length = 1;
        Str_18.Data = " ";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_18);
        prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar19);
        Str_19.Length = 1;
        Str_19.Data = " ";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_19);
        prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar10);
        Str_20.Length = 1;
        Str_20.Data = "\n";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_20);
        return (int)prVar6;
      }
      return iVar4;
    }
    (*(code *)dump_dg._184_8_)(0x1348d8,&local_2f8);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_590);
  parseModule((char *)&local_610,(LLVMContext *)"llvm-slicer",(SlicerOptions *)local_590);
  if (local_610._M_head_impl == (Module *)0x0) goto LAB_00118866;
  SVar21.Length = (size_t)local_3f0._M_p;
  SVar21.Data = (char *)local_610._M_head_impl;
  lVar5 = llvm::Module::getFunction(SVar21);
  if (lVar5 == 0) {
    prVar6 = (raw_ostream *)llvm::errs();
    Str_00.Length = 0x1e;
    Str_00.Data = "The entry function not found: ";
    prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_00);
    prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_3f0._M_p);
    Str_01.Length = 1;
    Str_01.Data = "\n";
    llvm::raw_ostream::operator<<(prVar6,Str_01);
    goto LAB_00118866;
  }
  maybe_print_statistics(local_610._M_head_impl,"Statistics before ");
  local_5f0.M = local_610._M_head_impl;
  local_5f0.options = (SlicerOptions *)local_568;
  do {
    bVar1 = ModuleWriter::_removeUnusedFromModule(&local_5f0);
  } while (bVar1);
  if (remove_unused_only[0x80] == '\x01') {
    prVar6 = (raw_ostream *)llvm::errs();
    Str.Length = 0x39;
    Str.Data = "[llvm-slicer] removed unused parts of module, exiting...\n";
    llvm::raw_ostream::operator<<(prVar6,Str);
    maybe_print_statistics(local_610._M_head_impl,"Statistics after ");
    if (should_verify_module[0x80] == '\x01') {
      uVar3 = ModuleWriter::verifyAndWriteModule(&local_5f0);
    }
    else {
      bVar1 = ModuleWriter::writeModule(&local_5f0);
      uVar3 = (uint)bVar1;
    }
    goto LAB_00118866;
  }
  if ((local_39e == true) && (local_568[0x171] == true)) {
    prVar6 = (raw_ostream *)llvm::errs();
    Str_02.Length = 0x3d;
    Str_02.Data = "[llvm-slicer] threads are enabled, not cutting off diverging\n";
    llvm::raw_ostream::operator<<(prVar6,Str_02);
    local_39e = false;
  }
  else if (local_39e != false) {
    getSlicingCriteriaValues
              ((Module *)&local_5c0,(string *)local_610._M_head_impl,(string *)&local_398,
               (string *)&local_378,SUB81(local_358,0));
    if ((char *)local_5c0._M_impl._0_8_ ==
        (char *)CONCAT44(local_5c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                         local_5c0._M_impl.super__Rb_tree_header._M_header._M_color)) {
      prVar6 = (raw_ostream *)llvm::errs();
      Str_03.Length = 0x20;
      Str_03.Data = "No reachable slicing criteria: \'";
      prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_03);
      prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_398._M_p);
      Str_04.Length = 3;
      Str_04.Data = "\' \'";
      prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_04);
      prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_378._M_p);
      Str_05.Length = 2;
      Str_05.Data = "\'\n";
      llvm::raw_ostream::operator<<(prVar6,Str_05);
      Slicer::Slicer(&local_2f8,local_610._M_head_impl,(SlicerOptions *)local_568);
      bVar1 = Slicer::createEmptyMain(&local_2f8,false);
      if (bVar1) {
        maybe_print_statistics(local_610._M_head_impl,"Statistics after ");
        uVar3 = ModuleWriter::cleanAndSaveModule(&local_5f0,(bool)should_verify_module[0x80]);
      }
      else {
        prVar6 = (raw_ostream *)llvm::errs();
        Str_07.Length = 0x25;
        Str_07.Data = "ERROR: failed creating an empty main\n";
        llvm::raw_ostream::operator<<(prVar6,Str_07);
        uVar3 = 1;
      }
      Slicer::~Slicer(&local_2f8);
LAB_001183cb:
      bVar1 = false;
    }
    else {
      cVar2 = dg::llvmdg::cutoffDivergingBranches
                        (local_610._M_head_impl,(string *)&local_3f0,(vector *)&local_5c0);
      if (cVar2 == '\0') {
        prVar6 = (raw_ostream *)llvm::errs();
        Str_06.Length = 0x35;
        Str_06.Data = "[llvm-slicer]: Failed cutting off diverging branches\n";
        llvm::raw_ostream::operator<<(prVar6,Str_06);
        uVar3 = 1;
        goto LAB_001183cb;
      }
      maybe_print_statistics(local_610._M_head_impl,"Statistics after cutoff-diverging ");
      bVar1 = true;
      uVar3 = 0;
    }
    if ((char *)local_5c0._M_impl._0_8_ != (char *)0x0) {
      operator_delete((void *)local_5c0._M_impl._0_8_,
                      (long)local_5c0._M_impl.super__Rb_tree_header._M_header._M_parent -
                      local_5c0._M_impl._0_8_);
    }
    if (!bVar1) goto LAB_00118866;
  }
  Slicer::Slicer(&local_2f8,local_610._M_head_impl,(SlicerOptions *)local_568);
  AVar11 = 0;
  bVar1 = Slicer::buildDG(&local_2f8,false);
  if (bVar1) {
    local_608.dg = (LLVMDependenceGraph *)
                   local_2f8._dg._M_t.
                   super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
                   .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
    if (annotationOpts_abi_cxx11_._136_8_ != 0) {
      local_5e0._M_head_impl =
           (LLVMDependenceGraph *)
           local_2f8._dg._M_t.
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
      splitList((string *)&local_5c0,-8);
      AVar11 = 0;
      for (pcVar18 = (char *)local_5c0._M_impl._0_8_;
          pcVar18 !=
          (char *)CONCAT44(local_5c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_5c0._M_impl.super__Rb_tree_header._M_header._M_color);
          pcVar18 = pcVar18 + 0x20) {
        iVar4 = std::__cxx11::string::compare(pcVar18);
        if (iVar4 == 0) {
          AVar11 = AVar11 | ANNOTATE_DD;
        }
        else {
          iVar4 = std::__cxx11::string::compare(pcVar18);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(pcVar18), iVar4 == 0)) {
            AVar11 = AVar11 | ANNOTATE_CD;
          }
          else {
            iVar4 = std::__cxx11::string::compare(pcVar18);
            if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(pcVar18), iVar4 == 0)) {
              AVar11 = AVar11 | ANNOTATE_DEF;
            }
            else {
              iVar4 = std::__cxx11::string::compare(pcVar18);
              if (iVar4 == 0) {
                AVar11 = AVar11 | ANNOTATE_PTR;
              }
              else {
                iVar4 = std::__cxx11::string::compare(pcVar18);
                if (iVar4 == 0) {
                  AVar11 = AVar11 | ANNOTATE_MEMORYACC;
                }
                else {
                  iVar4 = std::__cxx11::string::compare(pcVar18);
                  if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(pcVar18), iVar4 == 0))
                     || (iVar4 = std::__cxx11::string::compare(pcVar18), iVar4 == 0)) {
                    AVar11 = AVar11 | ANNOTATE_SLICE;
                  }
                }
              }
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5c0);
      local_608.dg = local_5e0._M_head_impl;
    }
    local_5c0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_5c0._M_impl.super__Rb_tree_header._M_header;
    local_5c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_5c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_5c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_608.options = (SlicerOptions *)local_568;
    local_608.annotationOptions = AVar11;
    local_5c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_5c0._M_impl.super__Rb_tree_header._M_header._M_left;
    cVar2 = getSlicingCriteriaNodes
                      ((LLVMDependenceGraph *)
                       local_2f8._dg._M_t.
                       super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
                       .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl,
                       (string *)&local_398,(string *)&local_378,local_358,(set *)&local_5c0,
                       local_39d);
    if (cVar2 == '\0') {
      prVar6 = (raw_ostream *)llvm::errs();
      Str_09.Length = 0x29;
      Str_09.Data = "ERROR: Failed finding slicing criteria: \'";
      prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_09);
      prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_398._M_p);
      Str_10.Length = 2;
      Str_10.Data = "\'\n";
      llvm::raw_ostream::operator<<(prVar6,Str_10);
      uVar3 = 1;
      if (local_608.annotationOptions != 0) {
        Slicer::computeDependencies(&local_2f8);
        ModuleAnnotator::annotate
                  (&local_608,
                   (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)0x0);
      }
    }
    else {
      if (local_5c0._M_impl.super__Rb_tree_header._M_node_count == 0) {
        prVar6 = (raw_ostream *)llvm::errs();
        Str_11.Length = 0x20;
        Str_11.Data = "No reachable slicing criteria: \'";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_11);
        prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_398._M_p);
        Str_12.Length = 3;
        Str_12.Data = "\' \'";
        prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_12);
        prVar6 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar6,(ulong)local_378._M_p);
        Str_13.Length = 2;
        Str_13.Data = "\'\n";
        llvm::raw_ostream::operator<<(prVar6,Str_13);
        if (local_608.annotationOptions != 0) {
          Slicer::computeDependencies(&local_2f8);
          ModuleAnnotator::annotate
                    (&local_608,
                     (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                      *)0x0);
        }
        bVar1 = Slicer::createEmptyMain(&local_2f8,false);
        if (bVar1) {
LAB_001187e1:
          maybe_print_statistics(local_610._M_head_impl,"Statistics after ");
          uVar3 = ModuleWriter::cleanAndSaveModule(&local_5f0,(bool)should_verify_module[0x80]);
          goto LAB_0011884b;
        }
        prVar6 = (raw_ostream *)llvm::errs();
        pcVar18 = "ERROR: failed creating an empty main\n";
        sVar9 = 0x25;
      }
      else {
        bVar1 = Slicer::mark(&local_2f8,
                             (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                              *)&local_5c0);
        if (bVar1) {
          if (local_608.annotationOptions != 0) {
            ModuleAnnotator::annotate
                      (&local_608,
                       (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                        *)&local_5c0);
          }
          local_5d8.dg = (LLVMDependenceGraph *)
                         local_2f8._dg._M_t.
                         super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
                         .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
          local_5d8.bb_only = (bool)dump_bb_only[0x80];
          local_5d8.dump_opts = 0x154;
          local_5d8.options = (SlicerOptions *)local_568;
          if (dump_dg[0x80] == '\x01') {
            uVar3 = 0;
            DGDumper::dumpToDot(&local_5d8,(char *)0x0);
            if (dump_dg_only[0x80] != '\0') goto LAB_0011884b;
          }
          bVar1 = Slicer::slice(&local_2f8);
          if (bVar1) {
            if (dump_dg[0x80] == '\x01') {
              DGDumper::dumpToDot(&local_5d8,".sliced.dot");
            }
            goto LAB_001187e1;
          }
          prVar6 = (raw_ostream *)llvm::errs();
          pcVar18 = "ERROR: Slicing failed\n";
          sVar9 = 0x16;
        }
        else {
          prVar6 = (raw_ostream *)llvm::errs();
          pcVar18 = "Finding dependent nodes failed\n";
          sVar9 = 0x1f;
        }
      }
      Str_14.Length = sVar9;
      Str_14.Data = pcVar18;
      llvm::raw_ostream::operator<<(prVar6,Str_14);
      uVar3 = 1;
    }
LAB_0011884b:
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_M_erase(&local_5c0,(_Link_type)local_5c0._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  else {
    prVar6 = (raw_ostream *)llvm::errs();
    Str_08.Length = 0x1a;
    Str_08.Data = "ERROR: Failed building DG\n";
    llvm::raw_ostream::operator<<(prVar6,Str_08);
    uVar3 = 1;
  }
  Slicer::~Slicer(&local_2f8);
LAB_00118866:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_610);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_590);
  SlicerOptions::~SlicerOptions((SlicerOptions *)local_568);
  return uVar3;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);

#if ((LLVM_VERSION_MAJOR >= 6))
    llvm::cl::SetVersionPrinter([](llvm::raw_ostream & /*unused*/) {
        printf("%s\n", GIT_VERSION);
    });
#else
    llvm::cl::SetVersionPrinter([]() { printf("%s\n", GIT_VERSION); });
#endif

    SlicerOptions options = parseSlicerOptions(argc, argv,
                                               /* requireCrit = */ true);

    if (enable_debug) {
        DBG_ENABLE();
    }

    // dump_dg_only implies dumg_dg
    if (dump_dg_only) {
        dump_dg = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-slicer", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    maybe_print_statistics(M.get(), "Statistics before ");

    // remove unused from module, we don't need that
    ModuleWriter writer(options, M.get());
    writer.removeUnusedFromModule();

    if (remove_unused_only) {
        errs() << "[llvm-slicer] removed unused parts of module, exiting...\n";
        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.saveModule(should_verify_module);
    }

    /// ---------------
    // slice the code
    /// ---------------
    if (options.cutoffDiverging && options.dgOptions.threads) {
        llvm::errs() << "[llvm-slicer] threads are enabled, not cutting off "
                        "diverging\n";
        options.cutoffDiverging = false;
    }

    if (options.cutoffDiverging) {
        DBG(llvm - slicer, "Searching for slicing criteria values");
        auto csvalues = getSlicingCriteriaValues(
                *M, options.slicingCriteria, options.legacySlicingCriteria,
                options.legacySecondarySlicingCriteria,
                options.criteriaAreNextInstr);
        if (csvalues.empty()) {
            llvm::errs() << "No reachable slicing criteria: '"
                         << options.slicingCriteria << "' '"
                         << options.legacySlicingCriteria << "'\n";
            ::Slicer slicer(M.get(), options);
            if (!slicer.createEmptyMain()) {
                llvm::errs() << "ERROR: failed creating an empty main\n";
                return 1;
            }

            maybe_print_statistics(M.get(), "Statistics after ");
            return writer.cleanAndSaveModule(should_verify_module);
        }

        DBG(llvm - slicer, "Cutting off diverging branches");
        if (!llvmdg::cutoffDivergingBranches(
                    *M, options.dgOptions.entryFunction, csvalues)) {
            errs() << "[llvm-slicer]: Failed cutting off diverging branches\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after cutoff-diverging ");
    }

    ::Slicer slicer(M.get(), options);
    if (!slicer.buildDG()) {
        errs() << "ERROR: Failed building DG\n";
        return 1;
    }

    ModuleAnnotator annotator(options, &slicer.getDG(),
                              parseAnnotationOptions(annotationOpts));

    std::set<LLVMNode *> criteria_nodes;
    if (!getSlicingCriteriaNodes(slicer.getDG(), options.slicingCriteria,
                                 options.legacySlicingCriteria,
                                 options.legacySecondarySlicingCriteria,
                                 criteria_nodes,
                                 options.criteriaAreNextInstr)) {
        llvm::errs() << "ERROR: Failed finding slicing criteria: '"
                     << options.slicingCriteria << "'\n";

        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        return 1;
    }

    if (criteria_nodes.empty()) {
        llvm::errs() << "No reachable slicing criteria: '"
                     << options.slicingCriteria << "' '"
                     << options.legacySlicingCriteria << "'\n";
        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        if (!slicer.createEmptyMain()) {
            llvm::errs() << "ERROR: failed creating an empty main\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.cleanAndSaveModule(should_verify_module);
    }

    // mark nodes that are going to be in the slice
    if (!slicer.mark(criteria_nodes)) {
        llvm::errs() << "Finding dependent nodes failed\n";
        return 1;
    }

    // print debugging llvm IR if user asked for it
    if (annotator.shouldAnnotate())
        annotator.annotate(&criteria_nodes);

    DGDumper dumper(options, &slicer.getDG(), dump_bb_only);
    if (dump_dg) {
        dumper.dumpToDot();

        if (dump_dg_only)
            return 0;
    }

    // slice the graph
    if (!slicer.slice()) {
        errs() << "ERROR: Slicing failed\n";
        return 1;
    }

    if (dump_dg) {
        dumper.dumpToDot(".sliced.dot");
    }

    // remove unused from module again, since slicing
    // could and probably did make some other parts unused
    maybe_print_statistics(M.get(), "Statistics after ");
    return writer.cleanAndSaveModule(should_verify_module);
}